

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

ma_result ma_spatializer_init_preallocated
                    (ma_spatializer_config *pConfig,void *pHeap,ma_spatializer *pSpatializer)

{
  uint channels;
  ma_handedness mVar1;
  ma_channel *pIn;
  ma_result mVar2;
  ma_spatializer_heap_layout heapLayout;
  ma_gainer_config gainerConfig;
  ma_spatializer_heap_layout local_48;
  ma_gainer_config local_28;
  
  mVar2 = MA_INVALID_ARGS;
  if (pSpatializer != (ma_spatializer *)0x0) {
    memset(pSpatializer,0,0xb8);
    if (pHeap != (void *)0x0 && pConfig != (ma_spatializer_config *)0x0) {
      mVar2 = ma_spatializer_get_heap_layout(pConfig,&local_48);
      if (mVar2 == MA_SUCCESS) {
        pSpatializer->_pHeap = pHeap;
        if (local_48.sizeInBytes != 0) {
          memset(pHeap,0,local_48.sizeInBytes);
        }
        channels = pConfig->channelsIn;
        pSpatializer->channelsIn = channels;
        pSpatializer->channelsOut = pConfig->channelsOut;
        pSpatializer->attenuationModel = pConfig->attenuationModel;
        pSpatializer->positioning = pConfig->positioning;
        mVar1 = pConfig->handedness;
        pSpatializer->handedness = mVar1;
        pSpatializer->minGain = pConfig->minGain;
        pSpatializer->maxGain = pConfig->maxGain;
        pSpatializer->minDistance = pConfig->minDistance;
        pSpatializer->maxDistance = pConfig->maxDistance;
        pSpatializer->rolloff = pConfig->rolloff;
        pSpatializer->coneInnerAngleInRadians = pConfig->coneInnerAngleInRadians;
        pSpatializer->coneOuterAngleInRadians = pConfig->coneOuterAngleInRadians;
        pSpatializer->coneOuterGain = pConfig->coneOuterGain;
        pSpatializer->dopplerFactor = pConfig->dopplerFactor;
        pSpatializer->directionalAttenuationFactor = pConfig->directionalAttenuationFactor;
        pSpatializer->gainSmoothTimeInFrames = pConfig->gainSmoothTimeInFrames;
        (pSpatializer->position).x = 0.0;
        (pSpatializer->position).y = 0.0;
        *(undefined8 *)&(pSpatializer->position).z = 0;
        (pSpatializer->direction).y = 0.0;
        (pSpatializer->direction).z = -1.0;
        (pSpatializer->velocity).x = 0.0;
        (pSpatializer->velocity).y = 0.0;
        *(undefined8 *)&(pSpatializer->velocity).z = 0x3f80000000000000;
        if (mVar1 == ma_handedness_left) {
          (pSpatializer->direction).x = -0.0;
          (pSpatializer->direction).y = -0.0;
          (pSpatializer->direction).z = 1.0;
        }
        pIn = pConfig->pChannelMapIn;
        if (pIn != (ma_channel *)0x0) {
          pSpatializer->pChannelMapIn = (ma_channel *)(local_48.channelMapInOffset + (long)pHeap);
          ma_channel_map_copy_or_default
                    ((ma_channel *)(local_48.channelMapInOffset + (long)pHeap),(ulong)channels,pIn,
                     channels);
        }
        pSpatializer->pNewChannelGainsOut = (float *)(local_48.newChannelGainsOffset + (long)pHeap);
        local_28.smoothTimeInFrames = pConfig->gainSmoothTimeInFrames;
        local_28.channels = pConfig->channelsOut;
        mVar2 = ma_gainer_init_preallocated
                          (&local_28,(void *)((long)pHeap + local_48.gainerOffset),
                           &pSpatializer->gainer);
      }
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_spatializer_init_preallocated(const ma_spatializer_config* pConfig, void* pHeap, ma_spatializer* pSpatializer)
{
    ma_result result;
    ma_spatializer_heap_layout heapLayout;
    ma_gainer_config gainerConfig;

    if (pSpatializer == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pSpatializer);

    if (pConfig == NULL || pHeap == NULL) {
        return MA_INVALID_ARGS;
    }

    result = ma_spatializer_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    pSpatializer->_pHeap = pHeap;
    MA_ZERO_MEMORY(pHeap, heapLayout.sizeInBytes);

    pSpatializer->channelsIn                   = pConfig->channelsIn;
    pSpatializer->channelsOut                  = pConfig->channelsOut;
    pSpatializer->attenuationModel             = pConfig->attenuationModel;
    pSpatializer->positioning                  = pConfig->positioning;
    pSpatializer->handedness                   = pConfig->handedness;
    pSpatializer->minGain                      = pConfig->minGain;
    pSpatializer->maxGain                      = pConfig->maxGain;
    pSpatializer->minDistance                  = pConfig->minDistance;
    pSpatializer->maxDistance                  = pConfig->maxDistance;
    pSpatializer->rolloff                      = pConfig->rolloff;
    pSpatializer->coneInnerAngleInRadians      = pConfig->coneInnerAngleInRadians;
    pSpatializer->coneOuterAngleInRadians      = pConfig->coneOuterAngleInRadians;
    pSpatializer->coneOuterGain                = pConfig->coneOuterGain;
    pSpatializer->dopplerFactor                = pConfig->dopplerFactor;
    pSpatializer->directionalAttenuationFactor = pConfig->directionalAttenuationFactor;
    pSpatializer->gainSmoothTimeInFrames       = pConfig->gainSmoothTimeInFrames;
    pSpatializer->position                     = ma_vec3f_init_3f(0, 0,  0);
    pSpatializer->direction                    = ma_vec3f_init_3f(0, 0, -1);
    pSpatializer->velocity                     = ma_vec3f_init_3f(0, 0,  0);
    pSpatializer->dopplerPitch                 = 1;

    /* Swap the forward direction if we're left handed (it was initialized based on right handed). */
    if (pSpatializer->handedness == ma_handedness_left) {
        pSpatializer->direction = ma_vec3f_neg(pSpatializer->direction);
    }

    /* Channel map. This will be on the heap. */
    if (pConfig->pChannelMapIn != NULL) {
        pSpatializer->pChannelMapIn = (ma_channel*)ma_offset_ptr(pHeap, heapLayout.channelMapInOffset);
        ma_channel_map_copy_or_default(pSpatializer->pChannelMapIn, pSpatializer->channelsIn, pConfig->pChannelMapIn, pSpatializer->channelsIn);
    }

    /* New channel gains for output channels. */
    pSpatializer->pNewChannelGainsOut = (float*)ma_offset_ptr(pHeap, heapLayout.newChannelGainsOffset);

    /* Gainer. */
    gainerConfig = ma_spatializer_gainer_config_init(pConfig);

    result = ma_gainer_init_preallocated(&gainerConfig, ma_offset_ptr(pHeap, heapLayout.gainerOffset), &pSpatializer->gainer);
    if (result != MA_SUCCESS) {
        return result;  /* Failed to initialize the gainer. */
    }

    return MA_SUCCESS;
}